

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadedSocketInitiator.cpp
# Opt level: O0

void __thiscall
FIX::ThreadedSocketInitiator::onConfigure(ThreadedSocketInitiator *this,SessionSettings *s)

{
  bool bVar1;
  int iVar2;
  Dictionary *pDVar3;
  allocator<char> local_169;
  string local_168;
  allocator<char> local_141;
  string local_140;
  allocator<char> local_119;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  Dictionary *local_20;
  Dictionary *dict;
  SessionSettings *s_local;
  ThreadedSocketInitiator *this_local;
  
  dict = (Dictionary *)s;
  s_local = (SessionSettings *)this;
  pDVar3 = SessionSettings::get(s);
  local_20 = pDVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"ReconnectInterval",&local_41);
  bVar1 = Dictionary::has(pDVar3,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  pDVar3 = local_20;
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"ReconnectInterval",&local_79);
    iVar2 = Dictionary::getInt(pDVar3,&local_78);
    this->m_reconnectInterval = iVar2;
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
  }
  pDVar3 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"SocketNodelay",&local_a1);
  bVar1 = Dictionary::has(pDVar3,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  pDVar3 = local_20;
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"SocketNodelay",&local_c9);
    bVar1 = Dictionary::getBool(pDVar3,&local_c8);
    this->m_noDelay = bVar1;
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
  }
  pDVar3 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"SocketSendBufferSize",&local_f1);
  bVar1 = Dictionary::has(pDVar3,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  pDVar3 = local_20;
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"SocketSendBufferSize",&local_119);
    iVar2 = Dictionary::getInt(pDVar3,&local_118);
    this->m_sendBufSize = iVar2;
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator(&local_119);
  }
  pDVar3 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"SocketReceiveBufferSize",&local_141);
  bVar1 = Dictionary::has(pDVar3,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator(&local_141);
  pDVar3 = local_20;
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_168,"SocketReceiveBufferSize",&local_169);
    iVar2 = Dictionary::getInt(pDVar3,&local_168);
    this->m_rcvBufSize = iVar2;
    std::__cxx11::string::~string((string *)&local_168);
    std::allocator<char>::~allocator(&local_169);
  }
  return;
}

Assistant:

EXCEPT(ConfigError) {
  const Dictionary &dict = s.get();

  if (dict.has(RECONNECT_INTERVAL)) // ReconnectInterval in [DEFAULT]
  {
    m_reconnectInterval = dict.getInt(RECONNECT_INTERVAL);
  }
  if (dict.has(SOCKET_NODELAY)) {
    m_noDelay = dict.getBool(SOCKET_NODELAY);
  }
  if (dict.has(SOCKET_SEND_BUFFER_SIZE)) {
    m_sendBufSize = dict.getInt(SOCKET_SEND_BUFFER_SIZE);
  }
  if (dict.has(SOCKET_RECEIVE_BUFFER_SIZE)) {
    m_rcvBufSize = dict.getInt(SOCKET_RECEIVE_BUFFER_SIZE);
  }
}